

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::process(Chromosome *this)

{
  if (this->changed == true) {
    createCoordinatePath(this,(Coordinate)ZEXT812(0));
    walkPath(this);
    calcFitness(this);
    this->changed = false;
  }
  return;
}

Assistant:

void Chromosome::process() {

    if (changed){
        Coordinate start;
        createCoordinatePath(start);
        walkPath();
        calcFitness();
        changed = false;
    }

}